

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O1

int gauden_compute_euclidean(float64 ***out,uint32 ***w_idx,vector_t *obs,gauden_t *g)

{
  uint uVar1;
  uint uVar2;
  float64 **ppfVar3;
  uint32 **ppuVar4;
  uint32 *puVar5;
  vector_t **pppfVar6;
  float64 *pfVar7;
  uint32 *puVar8;
  vector_t pfVar9;
  vector_t *ppfVar10;
  bool bVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar17;
  ulong uVar18;
  double dVar19;
  double dVar20;
  float64 fVar21;
  ulong local_78;
  ulong uVar16;
  
  if (g->n_mgau != 0) {
    local_78 = 0;
    do {
      if (g->n_feat != 0) {
        ppfVar3 = out[local_78];
        ppuVar4 = w_idx[local_78];
        puVar5 = g->veclen;
        pppfVar6 = g->mean[local_78];
        uVar18 = 0;
        do {
          pfVar7 = ppfVar3[uVar18];
          puVar8 = ppuVar4[uVar18];
          uVar1 = g->n_density;
          uVar15 = g->n_top;
          uVar17 = (ulong)uVar15;
          uVar2 = puVar5[uVar18];
          pfVar9 = obs[uVar18];
          ppfVar10 = pppfVar6[uVar18];
          if (uVar17 != 0) {
            uVar12 = 0;
            do {
              pfVar7[uVar12] = 1.8e+307;
              uVar12 = uVar12 + 1;
            } while (uVar17 != uVar12);
          }
          if ((ulong)uVar1 != 0) {
            uVar15 = uVar15 - 1;
            uVar16 = (ulong)uVar15;
            fVar21 = pfVar7[uVar16];
            uVar12 = 0;
            do {
              dVar19 = 0.0;
              bVar11 = 0.0 < (double)fVar21;
              if (((ulong)uVar2 != 0) && (0.0 < (double)fVar21)) {
                uVar13 = 1;
                do {
                  dVar20 = (double)(pfVar9[uVar13 - 1] - ppfVar10[uVar12][uVar13 - 1]);
                  dVar19 = dVar20 * dVar20 + dVar19;
                  bVar11 = dVar19 < (double)fVar21;
                  if (uVar2 <= uVar13) break;
                  uVar13 = uVar13 + 1;
                } while (dVar19 < (double)fVar21);
              }
              if (bVar11) {
                uVar14 = 0;
                uVar13 = uVar14;
                if (uVar17 != 0) {
                  do {
                    uVar13 = uVar14;
                    if (dVar19 < (double)pfVar7[uVar14]) break;
                    uVar14 = uVar14 + 1;
                    uVar13 = uVar17;
                  } while (uVar17 != uVar14);
                }
                uVar14 = (ulong)uVar15;
                if ((uint)uVar13 < uVar15) {
                  uVar14 = uVar16;
                  do {
                    pfVar7[uVar14] = pfVar7[uVar14 - 1];
                    puVar8[uVar14] = puVar8[uVar14 - 1];
                    uVar14 = uVar14 - 1;
                  } while ((uVar13 & 0xffffffff) < uVar14);
                }
                if ((uint)uVar13 != (uint)uVar14) {
                  __assert_fail("j == k",
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                                ,0x463,
                                "void euclidean_dist(float64 *, uint32 *, uint32, uint32, uint32, vector_t, vector_t *)"
                               );
                }
                pfVar7[uVar14 & 0xffffffff] = (float64)dVar19;
                puVar8[uVar14 & 0xffffffff] = (uint32)uVar12;
                fVar21 = pfVar7[uVar16];
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != uVar1);
          }
          uVar18 = uVar18 + 1;
        } while (uVar18 < g->n_feat);
      }
      local_78 = local_78 + 1;
    } while (local_78 < g->n_mgau);
  }
  return 0;
}

Assistant:

int
gauden_compute_euclidean(float64 ***out,
			 uint32 ***w_idx,
			 vector_t *obs,
			 gauden_t *g)
{
    uint32 i, j;

    for (i = 0; i < g->n_mgau; i++) {
	for (j = 0; j < g->n_feat; j++) {

	    euclidean_dist(out[i][j],
			   w_idx[i][j],
			   g->n_top,
			   g->n_density,
			   g->veclen[j],
			   obs[j],
			   g->mean[i][j]);
	    
#ifdef GAUDEN_VERBOSE
	    gauden_print(stdout,
			 out, w_idx, g,
			 NULL, 0);
#endif
	}
    }

    return S3_SUCCESS;
}